

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

lzma_ret lzma_lzma_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  byte bVar1;
  undefined4 *ptr;
  uint uVar2;
  char cVar3;
  uint uVar4;
  lzma_ret lVar5;
  byte bVar6;
  
  lVar5 = LZMA_OPTIONS_ERROR;
  if (props_size == 5) {
    ptr = (undefined4 *)lzma_alloc(0x70,allocator);
    if (ptr == (undefined4 *)0x0) {
      lVar5 = LZMA_MEM_ERROR;
    }
    else {
      bVar1 = *props;
      if (bVar1 < 0xe1) {
        cVar3 = (char)((uint)bVar1 * 0x6d >> 8);
        bVar6 = (byte)(((byte)(bVar1 - cVar3) >> 1) + cVar3) >> 5;
        ptr[7] = (uint)bVar6;
        uVar2 = (uint)(byte)(bVar6 * -0x2d + bVar1);
        uVar4 = uVar2 / 9;
        ptr[6] = uVar4;
        uVar2 = uVar2 % 9;
        ptr[5] = uVar2;
        if (uVar2 + uVar4 < 5) {
          *ptr = *(undefined4 *)(props + 1);
          *(undefined8 *)(ptr + 2) = 0;
          ptr[4] = 0;
          *options = ptr;
          return LZMA_OK;
        }
      }
      lzma_free(ptr,allocator);
    }
  }
  return lVar5;
}

Assistant:

extern lzma_ret
lzma_lzma_props_decode(void **options, lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	lzma_options_lzma *opt;

	if (props_size != 5)
		return LZMA_OPTIONS_ERROR;

	opt = lzma_alloc(sizeof(lzma_options_lzma), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	if (lzma_lzma_lclppb_decode(opt, props[0]))
		goto error;

	// All dictionary sizes are accepted, including zero. LZ decoder
	// will automatically use a dictionary at least a few KiB even if
	// a smaller dictionary is requested.
	opt->dict_size = unaligned_read32le(props + 1);

	opt->preset_dict = NULL;
	opt->preset_dict_size = 0;

	*options = opt;

	return LZMA_OK;

error:
	lzma_free(opt, allocator);
	return LZMA_OPTIONS_ERROR;
}